

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O2

Vector3d *
RigidBodyDynamics::CalcBodyToBaseCoordinates
          (Vector3d *__return_storage_ptr__,Model *model,VectorNd *Q,uint body_id,
          Vector3d *point_body_coordinates,bool update_kinematics)

{
  Vector3d *pVVar1;
  uint uVar2;
  pointer pSVar3;
  pointer pFVar4;
  SpatialTransform *pSVar5;
  uint uVar6;
  undefined3 in_register_00000089;
  Vector3d body_position;
  Vector3d parent_body_position;
  Vector3d fixed_position;
  Matrix3d parent_body_rotation;
  Matrix3d body_rotation;
  pointer local_138;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *pPStack_130;
  undefined8 *local_128;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_120;
  Vector3d *local_118;
  undefined1 local_f8 [56];
  pointer local_c0;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_b8;
  Vector3d *local_b0;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> local_78 [72];
  
  if (CONCAT31(in_register_00000089,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  uVar6 = body_id - model->fixed_body_discriminator;
  if (body_id < model->fixed_body_discriminator) {
    local_c0 = (model->X_base).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + body_id;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              (local_78,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                        &local_c0);
    pSVar3 = (model->X_base).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128 = *(undefined8 **)((long)&pSVar3[body_id].r.super_Vector3d + 0x10);
    local_c0 = (pointer)&local_138;
    pVVar1 = &pSVar3[body_id].r;
    local_138 = *(pointer *)
                 &(pVVar1->super_Vector3d).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    pPStack_130 = *(PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> **)
                   ((long)&(pVVar1->super_Vector3d).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
    local_b8 = local_78;
    local_b0 = point_body_coordinates;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                *)&local_c0);
  }
  else {
    pFVar4 = (model->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_c0 = &pFVar4[uVar6].mParentTransform;
    uVar2 = pFVar4[uVar6].mMovableParent;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              (local_78,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                        &local_c0);
    pFVar4 = (model->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8._48_8_ = *(double *)((long)&pFVar4[uVar6].mParentTransform.r + 0x10);
    pSVar5 = &pFVar4[uVar6].mParentTransform;
    local_f8._32_8_ = *(undefined8 *)&(pSVar5->r).super_Vector3d;
    local_f8._40_8_ = *(double *)((long)&pSVar5->r + 8);
    local_138 = (model->X_base).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar2;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_c0,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)&local_138);
    pSVar3 = (model->X_base).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8._16_8_ = *(double *)((long)&pSVar3[uVar2].r.super_Vector3d + 0x10);
    local_138 = (pointer)local_f8;
    pVVar1 = &pSVar3[uVar2].r;
    local_f8._0_8_ =
         *(undefined8 *)
          &(pVVar1->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    local_f8._8_8_ =
         *(double *)
          ((long)&(pVVar1->super_Vector3d).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
    local_120 = local_78;
    pPStack_130 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_c0;
    local_128 = (undefined8 *)(local_f8 + 0x20);
    local_118 = point_body_coordinates;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>,0>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>_>
                *)&local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI
Vector3d CalcBodyToBaseCoordinates (
		Model &model,
		const VectorNd &Q,
		unsigned int body_id,
		const Vector3d &point_body_coordinates,
		bool update_kinematics) {
	// update the Kinematics if necessary
	if (update_kinematics) {
		UpdateKinematicsCustom (model, &Q, NULL, NULL);
	}

	if (body_id >= model.fixed_body_discriminator) {
		unsigned int fbody_id = body_id - model.fixed_body_discriminator;
		unsigned int parent_id = model.mFixedBodies[fbody_id].mMovableParent;

		Matrix3d fixed_rotation = model.mFixedBodies[fbody_id].mParentTransform.E.transpose();
		Vector3d fixed_position = model.mFixedBodies[fbody_id].mParentTransform.r;

		Matrix3d parent_body_rotation = model.X_base[parent_id].E.transpose();
		Vector3d parent_body_position = model.X_base[parent_id].r;
		return parent_body_position + parent_body_rotation * (fixed_position + fixed_rotation * (point_body_coordinates));
	}

	Matrix3d body_rotation = model.X_base[body_id].E.transpose();
	Vector3d body_position = model.X_base[body_id].r;

	return body_position + body_rotation * point_body_coordinates;
}